

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O2

void __thiscall Emulator::init_sdl(Emulator *this,char *game_name)

{
  SDL_AudioSpec *pSVar1;
  int iVar2;
  SDL_AudioDeviceID SVar3;
  SDL_Window *pSVar4;
  SDL_Renderer *pSVar5;
  SDL_Texture *pSVar6;
  undefined8 uVar7;
  __off_t _Var8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong __nbytes;
  char window_name [32];
  
  pcVar10 = (char *)0x20;
  snprintf(window_name,0x20,"CHIP-8 Emu: %s",game_name);
  (this->sdl).window = (SDL_Window *)0x0;
  (this->sdl).renderer = (SDL_Renderer *)0x0;
  (this->sdl).texture = (SDL_Texture *)0x0;
  (this->sdl).spec.freq = 0;
  (this->sdl).spec.format = 0;
  (this->sdl).spec.channels = '\0';
  (this->sdl).spec.silence = '\0';
  (this->sdl).spec.samples = 0;
  (this->sdl).spec.padding = 0;
  (this->sdl).spec.size = 0;
  (this->sdl).spec.callback = (SDL_AudioCallback)0x0;
  (this->sdl).spec.userdata = (void *)0x0;
  *(undefined8 *)&(this->sdl).audio_len = 0;
  (this->sdl).audio_buf = (uint8_t *)0x0;
  *(undefined8 *)&(this->sdl).audio_dev = 0;
  iVar2 = SDL_Init(0x30);
  if (iVar2 < 0) {
    error_sdl("SDL_Init");
LAB_001026a1:
    error_sdl("SDL_CreateWindow");
LAB_001026ad:
    error_sdl("SDL_LoadWAV");
  }
  else {
    pcVar10 = (char *)0x1fff0000;
    pSVar4 = (SDL_Window *)SDL_CreateWindow(window_name,0x1fff0000,0x1fff0000,0x500,0x280,4);
    (this->sdl).window = pSVar4;
    if (pSVar4 == (SDL_Window *)0x0) goto LAB_001026a1;
    pSVar5 = (SDL_Renderer *)SDL_CreateRenderer(pSVar4,0xffffffffffffffff,0);
    (this->sdl).renderer = pSVar5;
    SDL_RenderSetLogicalSize(pSVar5,0x500,0x280);
    pSVar6 = (SDL_Texture *)SDL_CreateTexture((this->sdl).renderer,0x16362004,1,0x40,0x20);
    (this->sdl).texture = pSVar6;
    uVar7 = SDL_RWFromFile("beep.wav","rb");
    pSVar1 = &(this->sdl).spec;
    pcVar10 = (char *)0x1;
    SDL_LoadWAV_RW(uVar7,1,pSVar1,&(this->sdl).audio_buf,&(this->sdl).audio_len);
    if (((this->sdl).audio_buf == (uint8_t *)0x0) || ((this->sdl).audio_len == 0))
    goto LAB_001026ad;
    pcVar10 = (char *)0x0;
    SVar3 = SDL_OpenAudioDevice(0,0,pSVar1,0,0);
    (this->sdl).audio_dev = SVar3;
    if (SVar3 != 0) {
      SDL_PauseAudioDevice(SVar3,0);
      return;
    }
  }
  pcVar11 = "SDL_OpenAudioDevice";
  error_sdl("SDL_OpenAudioDevice");
  iVar2 = open(pcVar10,0);
  if (iVar2 == -1) {
    error("open");
  }
  else {
    _Var8 = lseek(iVar2,0,2);
    lseek(iVar2,0,0);
    if ((int)_Var8 != -1) {
      __nbytes = (ulong)(int)_Var8;
      if (__nbytes < 0xe01) {
        uVar9 = read(iVar2,pcVar11 + 0x200,__nbytes);
        if (uVar9 == __nbytes) {
          close(iVar2);
          return;
        }
        pcVar10 = "read";
        error("read");
        destroy_sdl((Emulator *)pcVar10);
        return;
      }
      goto LAB_0010274a;
    }
  }
  error("lseek getting file size");
LAB_0010274a:
  __assert_fail("sizeof(memory)-0x200 >= size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/klecko[P]CHIP-8-Emu/src/emulator.cpp"
                ,0x90,"void Emulator::load(const char *)");
}

Assistant:

void Emulator::init_sdl(const char* game_name){
	// Create window name
	char window_name[32];
	snprintf(window_name, sizeof(window_name), "CHIP-8 Emu: %s", game_name);

	// Init SDL
	memset(&sdl, 0, sizeof(sdl));
	if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_AUDIO) < 0)
		error_sdl("SDL_Init");

	// Create window
	sdl.window = SDL_CreateWindow(window_name, SDL_WINDOWPOS_UNDEFINED, 
	                              SDL_WINDOWPOS_UNDEFINED, FRAMEBUF_W*20, 
	                              FRAMEBUF_H*20, SDL_WINDOW_SHOWN);
	if (sdl.window == NULL)
		error_sdl("SDL_CreateWindow");

	// Create renderer
	sdl.renderer = SDL_CreateRenderer(sdl.window, -1, 0);
	SDL_RenderSetLogicalSize(sdl.renderer, FRAMEBUF_W*20, FRAMEBUF_H*20);

	// Create texture that stores frame buffer
	sdl.texture = SDL_CreateTexture(sdl.renderer, SDL_PIXELFORMAT_ARGB8888,
	                                SDL_TEXTUREACCESS_STREAMING, FRAMEBUF_W,
	                                FRAMEBUF_H);

	// Load audio
	SDL_LoadWAV("beep.wav", &sdl.spec, &sdl.audio_buf, &sdl.audio_len);
	if (!sdl.audio_buf || !sdl.audio_len)
		error_sdl("SDL_LoadWAV");

	sdl.audio_dev = SDL_OpenAudioDevice(NULL, 0, &sdl.spec, NULL, 0);
	if (!sdl.audio_dev)
		error_sdl("SDL_OpenAudioDevice");

	SDL_PauseAudioDevice(sdl.audio_dev, 0);
}